

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-kv-cache.cpp
# Opt level: O0

void __thiscall
llama_kv_cache_unified::llama_kv_cache_unified
          (llama_kv_cache_unified *this,llama_hparams *hparams,callbacks *cbs)

{
  callbacks *in_RDX;
  _Invoker_type in_RSI;
  callbacks *in_RDI;
  
  llama_kv_cache::llama_kv_cache((llama_kv_cache *)in_RDI);
  *(undefined ***)&(in_RDI->get_rope_factors).super__Function_base._M_functor = &PTR_clear_00643b70;
  {unnamed_type#1}::llama_kv_cache_unified((anon_struct_24_1_ba1d5218_for_defrag_info *)0x440072);
  {unnamed_type#2}::llama_kv_cache_unified((anon_struct_24_1_6936e014_for_pending *)0x440080);
  in_RDI[1].get_rope_factors._M_invoker = in_RSI;
  callbacks::callbacks(in_RDI,in_RDX);
  in_RDI[3].get_rope_factors.super__Function_base._M_functor._M_pod_data[0] = '\0';
  in_RDI[3].get_rope_factors.super__Function_base._M_functor._M_pod_data[1] = '\0';
  in_RDI[3].get_rope_factors.super__Function_base._M_functor._M_pod_data[2] = '\0';
  in_RDI[3].get_rope_factors.super__Function_base._M_functor._M_pod_data[3] = '\x01';
  in_RDI[3].get_rope_factors.super__Function_base._M_functor._M_pod_data[4] = '\0';
  *(undefined4 *)((long)&in_RDI[3].get_rope_factors.super__Function_base._M_functor + 8) = 0;
  *(undefined4 *)((long)&in_RDI[3].get_rope_factors.super__Function_base._M_functor + 0xc) = 0;
  *(undefined4 *)&in_RDI[3].get_rope_factors.super__Function_base._M_manager = 0;
  *(undefined4 *)((long)&in_RDI[3].get_rope_factors.super__Function_base._M_manager + 4) = 0;
  std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::vector
            ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)0x4400d9);
  std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::vector
            ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)0x4400ea);
  std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::vector
            ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)0x4400fb);
  *(undefined4 *)&in_RDI[6].get_rope_factors.super__Function_base._M_functor = 1;
  *(undefined4 *)((long)&in_RDI[6].get_rope_factors.super__Function_base._M_functor + 4) = 1;
  std::
  vector<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ::vector((vector<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
            *)0x440120);
  std::
  vector<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
  ::vector((vector<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
            *)0x440131);
  return;
}

Assistant:

llama_kv_cache_unified::llama_kv_cache_unified(const llama_hparams & hparams, callbacks cbs) : hparams(hparams), cbs(std::move(cbs)) {
}